

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::ProfileTypes(ScriptContext *this)

{
  Output::Print(L"===============================================================================\n"
               );
  Output::Print(L"Types Profile %s\n",this->url);
  Output::Print(L"-------------------------------------------------------------------------------\n"
               );
  Output::Print(L"Dynamic Type Conversions:\n");
  Output::Print(L"    Null to Simple                 %8d\n",
                (ulong)(uint)this->convertNullToSimpleCount);
  Output::Print(L"    Deferred to SimpleMap          %8d\n",
                (ulong)(uint)this->convertDeferredToSimpleDictionaryCount);
  Output::Print(L"    Simple to Map                  %8d\n",
                (ulong)(uint)this->convertSimpleToDictionaryCount);
  Output::Print(L"    Simple to SimpleMap            %8d\n",
                (ulong)(uint)this->convertSimpleToSimpleDictionaryCount);
  Output::Print(L"    Path to SimpleMap (set)        %8d\n",
                (ulong)(uint)this->convertPathToDictionaryExceededLengthCount);
  Output::Print(L"    Path to SimpleMap (delete)     %8d\n",
                (ulong)(uint)this->convertPathToDictionaryDeletedCount);
  Output::Print(L"    Path to SimpleMap (attribute)  %8d\n",
                (ulong)(uint)this->convertPathToDictionaryAttributesCount);
  Output::Print(L"    Path to SimpleMap (item attr)  %8d\n",
                (ulong)(uint)this->convertPathToDictionaryItemAttributesCount);
  Output::Print(L"    Path to SimpleMap (proto)      %8d\n",
                (ulong)(uint)this->convertPathToDictionaryProtoCount);
  Output::Print(L"    Path to SimpleMap (no root)    %8d\n",
                (ulong)(uint)this->convertPathToDictionaryNoRootCount);
  Output::Print(L"    Path to SimpleMap (reset)      %8d\n",
                (ulong)(uint)this->convertPathToDictionaryResetCount);
  Output::Print(L"    Path to Map (accessor)         %8d\n",
                (ulong)(uint)this->convertPathToDictionaryAccessorsCount);
  Output::Print(L"    Path to Map (item accessor)    %8d\n",
                (ulong)(uint)this->convertPathToDictionaryItemAccessorsCount);
  Output::Print(L"    Path to Map (extensions)       %8d\n",
                (ulong)(uint)this->convertPathToDictionaryExtensionsCount);
  Output::Print(L"    Path to SimpleMap              %8d\n",
                (ulong)(uint)this->convertPathToSimpleDictionaryCount);
  Output::Print(L"    SimplePath to Path             %8d\n",
                (ulong)(uint)this->convertSimplePathToPathCount);
  Output::Print(L"    Shared SimpleMap to non-shared %8d\n",
                (ulong)(uint)this->convertSimpleSharedDictionaryToNonSharedCount);
  Output::Print(L"    Deferred to Map                %8d\n",
                (ulong)(uint)this->convertDeferredToDictionaryCount);
  Output::Print(L"    SimpleMap to Map               %8d\n",
                (ulong)(uint)this->convertSimpleDictionaryToDictionaryCount);
  Output::Print(L"    Path Cache Hits                %8d\n",(ulong)(uint)this->cacheCount);
  Output::Print(L"    Path Branches                  %8d\n",(ulong)(uint)this->branchCount);
  Output::Print(L"    Path Promotions                %8d\n",(ulong)(uint)this->promoteCount);
  Output::Print(L"    Path Length (max)              %8d\n",(ulong)(uint)this->maxPathLength);
  Output::Print(L"    PathTypeHandlers               %8d\n",(ulong)(uint)this->pathTypeHandlerCount)
  ;
  Output::Print(L"\n");
  Output::Print(L"Type Statistics:                   %8s   %8s\n",L"Types",L"Instances");
  Output::Print(L"    Undefined                      %8d   %8d\n",(ulong)(uint)this->typeCount[0],
                (ulong)(uint)this->instanceCount[0]);
  Output::Print(L"    Null                           %8d   %8d\n",(ulong)(uint)this->typeCount[1],
                (ulong)(uint)this->instanceCount[1]);
  Output::Print(L"    Boolean                        %8d   %8d\n",(ulong)(uint)this->typeCount[2],
                (ulong)(uint)this->instanceCount[2]);
  Output::Print(L"    Integer                        %8d   %8d\n",(ulong)(uint)this->typeCount[3],
                (ulong)(uint)this->instanceCount[3]);
  Output::Print(L"    Number                         %8d   %8d\n",(ulong)(uint)this->typeCount[4],
                (ulong)(uint)this->instanceCount[4]);
  Output::Print(L"    String                         %8d   %8d\n",(ulong)(uint)this->typeCount[7],
                (ulong)(uint)this->instanceCount[7]);
  Output::Print(L"    Object                         %8d   %8d\n",(ulong)(uint)this->typeCount[0x1c]
                ,(ulong)(uint)this->instanceCount[0x1c]);
  Output::Print(L"    Function                       %8d   %8d\n",(ulong)(uint)this->typeCount[0x1b]
                ,(ulong)(uint)this->instanceCount[0x1b]);
  Output::Print(L"    Array                          %8d   %8d\n",(ulong)(uint)this->typeCount[0x1d]
                ,(ulong)(uint)this->instanceCount[0x1d]);
  Output::Print(L"    Date                           %8d   %8d\n",(ulong)(uint)this->typeCount[0x22]
                ,(ulong)(uint)this->instanceCount[0x22]);
  Output::Print(L"    Symbol                         %8d   %8d\n",(ulong)(uint)this->typeCount[8],
                (ulong)(uint)this->instanceCount[8]);
  Output::Print(L"    RegEx                          %8d   %8d\n",(ulong)(uint)this->typeCount[0x23]
                ,(ulong)(uint)this->instanceCount[0x23]);
  Output::Print(L"    Error                          %8d   %8d\n",(ulong)(uint)this->typeCount[0x24]
                ,(ulong)(uint)this->instanceCount[0x24]);
  Output::Print(L"    Proxy                          %8d   %8d\n",(ulong)(uint)this->typeCount[0x1a]
                ,(ulong)(uint)this->instanceCount[0x1a]);
  Output::Print(L"    BooleanObject                  %8d   %8d\n",(ulong)(uint)this->typeCount[0x25]
                ,(ulong)(uint)this->instanceCount[0x25]);
  Output::Print(L"    NumberObject                   %8d   %8d\n",(ulong)(uint)this->typeCount[0x26]
                ,(ulong)(uint)this->instanceCount[0x26]);
  Output::Print(L"    StringObject                   %8d   %8d\n",(ulong)(uint)this->typeCount[0x27]
                ,(ulong)(uint)this->instanceCount[0x27]);
  Output::Print(L"    SymbolObject                   %8d   %8d\n",(ulong)(uint)this->typeCount[0x40]
                ,(ulong)(uint)this->instanceCount[0x40]);
  Output::Print(L"    GlobalObject                   %8d   %8d\n",(ulong)(uint)this->typeCount[0x50]
                ,(ulong)(uint)this->instanceCount[0x50]);
  Output::Print(L"    Enumerator                     %8d   %8d\n",(ulong)(uint)this->typeCount[10],
                (ulong)(uint)this->instanceCount[10]);
  Output::Print(L"    Int8Array                      %8d   %8d\n",(ulong)(uint)this->typeCount[0x2c]
                ,(ulong)(uint)this->instanceCount[0x2c]);
  Output::Print(L"    Uint8Array                     %8d   %8d\n",(ulong)(uint)this->typeCount[0x2d]
                ,(ulong)(uint)this->instanceCount[0x2d]);
  Output::Print(L"    Uint8ClampedArray              %8d   %8d\n",(ulong)(uint)this->typeCount[0x2e]
                ,(ulong)(uint)this->instanceCount[0x2e]);
  Output::Print(L"    Int16Array                     %8d   %8d\n",(ulong)(uint)this->typeCount[0x2f]
                ,(ulong)(uint)this->instanceCount[0x2f]);
  Output::Print(L"    Int16Array                     %8d   %8d\n",(ulong)(uint)this->typeCount[0x30]
                ,(ulong)(uint)this->instanceCount[0x30]);
  Output::Print(L"    Int32Array                     %8d   %8d\n",(ulong)(uint)this->typeCount[0x31]
                ,(ulong)(uint)this->instanceCount[0x31]);
  Output::Print(L"    Uint32Array                    %8d   %8d\n",(ulong)(uint)this->typeCount[0x32]
                ,(ulong)(uint)this->instanceCount[0x32]);
  Output::Print(L"    Float32Array                   %8d   %8d\n",(ulong)(uint)this->typeCount[0x33]
                ,(ulong)(uint)this->instanceCount[0x33]);
  Output::Print(L"    Float64Array                   %8d   %8d\n",(ulong)(uint)this->typeCount[0x34]
                ,(ulong)(uint)this->instanceCount[0x34]);
  Output::Print(L"    DataView                       %8d   %8d\n",(ulong)(uint)this->typeCount[0x3a]
                ,(ulong)(uint)this->instanceCount[0x3a]);
  Output::Print(L"    ModuleRoot                     %8d   %8d\n",(ulong)(uint)this->typeCount[0x51]
                ,(ulong)(uint)this->instanceCount[0x51]);
  Output::Print(L"    HostObject                     %8d   %8d\n",(ulong)(uint)this->typeCount[0x52]
                ,(ulong)(uint)this->instanceCount[0x52]);
  Output::Print(L"    HostDispatch                   %8d   %8d\n",(ulong)(uint)this->typeCount[0x17]
                ,(ulong)(uint)this->instanceCount[0x17]);
  Output::Print(L"    Arguments                      %8d   %8d\n",(ulong)(uint)this->typeCount[0x2a]
                ,(ulong)(uint)this->instanceCount[0x2a]);
  Output::Print(L"    ActivationObject               %8d   %8d\n",(ulong)(uint)this->typeCount[0x53]
                ,(ulong)(uint)this->instanceCount[0x53]);
  Output::Print(L"    Map                            %8d   %8d\n",(ulong)(uint)this->typeCount[0x3c]
                ,(ulong)(uint)this->instanceCount[0x3c]);
  Output::Print(L"    Set                            %8d   %8d\n",(ulong)(uint)this->typeCount[0x3d]
                ,(ulong)(uint)this->instanceCount[0x3d]);
  Output::Print(L"    WeakMap                        %8d   %8d\n",(ulong)(uint)this->typeCount[0x3e]
                ,(ulong)(uint)this->instanceCount[0x3e]);
  Output::Print(L"    WeakSet                        %8d   %8d\n",(ulong)(uint)this->typeCount[0x3f]
                ,(ulong)(uint)this->instanceCount[0x3f]);
  Output::Print(L"    ArrayIterator                  %8d   %8d\n",(ulong)(uint)this->typeCount[0x41]
                ,(ulong)(uint)this->instanceCount[0x41]);
  Output::Print(L"    MapIterator                    %8d   %8d\n",(ulong)(uint)this->typeCount[0x42]
                ,(ulong)(uint)this->instanceCount[0x42]);
  Output::Print(L"    SetIterator                    %8d   %8d\n",(ulong)(uint)this->typeCount[0x43]
                ,(ulong)(uint)this->instanceCount[0x43]);
  Output::Print(L"    StringIterator                 %8d   %8d\n",(ulong)(uint)this->typeCount[0x44]
                ,(ulong)(uint)this->instanceCount[0x44]);
  Output::Print(L"    Generator                      %8d   %8d\n",(ulong)(uint)this->typeCount[0x46]
                ,(ulong)(uint)this->instanceCount[0x46]);
  Output::Print(L"    AsyncGenerator                 %8d   %8d\n",(ulong)(uint)this->typeCount[0x47]
                ,(ulong)(uint)this->instanceCount[0x47]);
  Output::Flush();
  return;
}

Assistant:

void ScriptContext::ProfileTypes()
    {
        Output::Print(_u("===============================================================================\n"));
        Output::Print(_u("Types Profile %s\n"), this->url);
        Output::Print(_u("-------------------------------------------------------------------------------\n"));
        Output::Print(_u("Dynamic Type Conversions:\n"));
        Output::Print(_u("    Null to Simple                 %8d\n"), convertNullToSimpleCount);
        Output::Print(_u("    Deferred to SimpleMap          %8d\n"), convertDeferredToSimpleDictionaryCount);
        Output::Print(_u("    Simple to Map                  %8d\n"), convertSimpleToDictionaryCount);
        Output::Print(_u("    Simple to SimpleMap            %8d\n"), convertSimpleToSimpleDictionaryCount);
        Output::Print(_u("    Path to SimpleMap (set)        %8d\n"), convertPathToDictionaryExceededLengthCount);
        Output::Print(_u("    Path to SimpleMap (delete)     %8d\n"), convertPathToDictionaryDeletedCount);
        Output::Print(_u("    Path to SimpleMap (attribute)  %8d\n"), convertPathToDictionaryAttributesCount);
        Output::Print(_u("    Path to SimpleMap (item attr)  %8d\n"), convertPathToDictionaryItemAttributesCount);
        Output::Print(_u("    Path to SimpleMap (proto)      %8d\n"), convertPathToDictionaryProtoCount);
        Output::Print(_u("    Path to SimpleMap (no root)    %8d\n"), convertPathToDictionaryNoRootCount);
        Output::Print(_u("    Path to SimpleMap (reset)      %8d\n"), convertPathToDictionaryResetCount);
        Output::Print(_u("    Path to Map (accessor)         %8d\n"), convertPathToDictionaryAccessorsCount);
        Output::Print(_u("    Path to Map (item accessor)    %8d\n"), convertPathToDictionaryItemAccessorsCount);
        Output::Print(_u("    Path to Map (extensions)       %8d\n"), convertPathToDictionaryExtensionsCount);
        Output::Print(_u("    Path to SimpleMap              %8d\n"), convertPathToSimpleDictionaryCount);
        Output::Print(_u("    SimplePath to Path             %8d\n"), convertSimplePathToPathCount);
        Output::Print(_u("    Shared SimpleMap to non-shared %8d\n"), convertSimpleSharedDictionaryToNonSharedCount);
        Output::Print(_u("    Deferred to Map                %8d\n"), convertDeferredToDictionaryCount);
        Output::Print(_u("    SimpleMap to Map               %8d\n"), convertSimpleDictionaryToDictionaryCount);
        Output::Print(_u("    Path Cache Hits                %8d\n"), cacheCount);
        Output::Print(_u("    Path Branches                  %8d\n"), branchCount);
        Output::Print(_u("    Path Promotions                %8d\n"), promoteCount);
        Output::Print(_u("    Path Length (max)              %8d\n"), maxPathLength);
        Output::Print(_u("    PathTypeHandlers               %8d\n"), pathTypeHandlerCount);
        Output::Print(_u("\n"));
        Output::Print(_u("Type Statistics:                   %8s   %8s\n"), _u("Types"), _u("Instances"));
        Output::Print(_u("    Undefined                      %8d   %8d\n"), typeCount[TypeIds_Undefined], instanceCount[TypeIds_Undefined]);
        Output::Print(_u("    Null                           %8d   %8d\n"), typeCount[TypeIds_Null], instanceCount[TypeIds_Null]);
        Output::Print(_u("    Boolean                        %8d   %8d\n"), typeCount[TypeIds_Boolean], instanceCount[TypeIds_Boolean]);
        Output::Print(_u("    Integer                        %8d   %8d\n"), typeCount[TypeIds_Integer], instanceCount[TypeIds_Integer]);
        Output::Print(_u("    Number                         %8d   %8d\n"), typeCount[TypeIds_Number], instanceCount[TypeIds_Number]);
        Output::Print(_u("    String                         %8d   %8d\n"), typeCount[TypeIds_String], instanceCount[TypeIds_String]);
        Output::Print(_u("    Object                         %8d   %8d\n"), typeCount[TypeIds_Object], instanceCount[TypeIds_Object]);
        Output::Print(_u("    Function                       %8d   %8d\n"), typeCount[TypeIds_Function], instanceCount[TypeIds_Function]);
        Output::Print(_u("    Array                          %8d   %8d\n"), typeCount[TypeIds_Array], instanceCount[TypeIds_Array]);
        Output::Print(_u("    Date                           %8d   %8d\n"), typeCount[TypeIds_Date], instanceCount[TypeIds_Date]);
        Output::Print(_u("    Symbol                         %8d   %8d\n"), typeCount[TypeIds_Symbol], instanceCount[TypeIds_Symbol]);
        Output::Print(_u("    RegEx                          %8d   %8d\n"), typeCount[TypeIds_RegEx], instanceCount[TypeIds_RegEx]);
        Output::Print(_u("    Error                          %8d   %8d\n"), typeCount[TypeIds_Error], instanceCount[TypeIds_Error]);
        Output::Print(_u("    Proxy                          %8d   %8d\n"), typeCount[TypeIds_Proxy], instanceCount[TypeIds_Proxy]);
        Output::Print(_u("    BooleanObject                  %8d   %8d\n"), typeCount[TypeIds_BooleanObject], instanceCount[TypeIds_BooleanObject]);
        Output::Print(_u("    NumberObject                   %8d   %8d\n"), typeCount[TypeIds_NumberObject], instanceCount[TypeIds_NumberObject]);
        Output::Print(_u("    StringObject                   %8d   %8d\n"), typeCount[TypeIds_StringObject], instanceCount[TypeIds_StringObject]);
        Output::Print(_u("    SymbolObject                   %8d   %8d\n"), typeCount[TypeIds_SymbolObject], instanceCount[TypeIds_SymbolObject]);
        Output::Print(_u("    GlobalObject                   %8d   %8d\n"), typeCount[TypeIds_GlobalObject], instanceCount[TypeIds_GlobalObject]);
        Output::Print(_u("    Enumerator                     %8d   %8d\n"), typeCount[TypeIds_Enumerator], instanceCount[TypeIds_Enumerator]);
        Output::Print(_u("    Int8Array                      %8d   %8d\n"), typeCount[TypeIds_Int8Array], instanceCount[TypeIds_Int8Array]);
        Output::Print(_u("    Uint8Array                     %8d   %8d\n"), typeCount[TypeIds_Uint8Array], instanceCount[TypeIds_Uint8Array]);
        Output::Print(_u("    Uint8ClampedArray              %8d   %8d\n"), typeCount[TypeIds_Uint8ClampedArray], instanceCount[TypeIds_Uint8ClampedArray]);
        Output::Print(_u("    Int16Array                     %8d   %8d\n"), typeCount[TypeIds_Int16Array], instanceCount[TypeIds_Int16Array]);
        Output::Print(_u("    Int16Array                     %8d   %8d\n"), typeCount[TypeIds_Uint16Array], instanceCount[TypeIds_Uint16Array]);
        Output::Print(_u("    Int32Array                     %8d   %8d\n"), typeCount[TypeIds_Int32Array], instanceCount[TypeIds_Int32Array]);
        Output::Print(_u("    Uint32Array                    %8d   %8d\n"), typeCount[TypeIds_Uint32Array], instanceCount[TypeIds_Uint32Array]);
        Output::Print(_u("    Float32Array                   %8d   %8d\n"), typeCount[TypeIds_Float32Array], instanceCount[TypeIds_Float32Array]);
        Output::Print(_u("    Float64Array                   %8d   %8d\n"), typeCount[TypeIds_Float64Array], instanceCount[TypeIds_Float64Array]);
        Output::Print(_u("    DataView                       %8d   %8d\n"), typeCount[TypeIds_DataView], instanceCount[TypeIds_DataView]);
        Output::Print(_u("    ModuleRoot                     %8d   %8d\n"), typeCount[TypeIds_ModuleRoot], instanceCount[TypeIds_ModuleRoot]);
        Output::Print(_u("    HostObject                     %8d   %8d\n"), typeCount[TypeIds_HostObject], instanceCount[TypeIds_HostObject]);
        Output::Print(_u("    HostDispatch                   %8d   %8d\n"), typeCount[TypeIds_HostDispatch], instanceCount[TypeIds_HostDispatch]);
        Output::Print(_u("    Arguments                      %8d   %8d\n"), typeCount[TypeIds_Arguments], instanceCount[TypeIds_Arguments]);
        Output::Print(_u("    ActivationObject               %8d   %8d\n"), typeCount[TypeIds_ActivationObject], instanceCount[TypeIds_ActivationObject]);
        Output::Print(_u("    Map                            %8d   %8d\n"), typeCount[TypeIds_Map], instanceCount[TypeIds_Map]);
        Output::Print(_u("    Set                            %8d   %8d\n"), typeCount[TypeIds_Set], instanceCount[TypeIds_Set]);
        Output::Print(_u("    WeakMap                        %8d   %8d\n"), typeCount[TypeIds_WeakMap], instanceCount[TypeIds_WeakMap]);
        Output::Print(_u("    WeakSet                        %8d   %8d\n"), typeCount[TypeIds_WeakSet], instanceCount[TypeIds_WeakSet]);
        Output::Print(_u("    ArrayIterator                  %8d   %8d\n"), typeCount[TypeIds_ArrayIterator], instanceCount[TypeIds_ArrayIterator]);
        Output::Print(_u("    MapIterator                    %8d   %8d\n"), typeCount[TypeIds_MapIterator], instanceCount[TypeIds_MapIterator]);
        Output::Print(_u("    SetIterator                    %8d   %8d\n"), typeCount[TypeIds_SetIterator], instanceCount[TypeIds_SetIterator]);
        Output::Print(_u("    StringIterator                 %8d   %8d\n"), typeCount[TypeIds_StringIterator], instanceCount[TypeIds_StringIterator]);
        Output::Print(_u("    Generator                      %8d   %8d\n"), typeCount[TypeIds_Generator], instanceCount[TypeIds_Generator]);
        Output::Print(_u("    AsyncGenerator                 %8d   %8d\n"), typeCount[TypeIds_AsyncGenerator], instanceCount[TypeIds_AsyncGenerator]);
#if !DBG
        Output::Print(_u("    ** Instance statistics only available on debug builds...\n"));
#endif
        Output::Flush();
    }